

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoration_manager.cpp
# Opt level: O0

void __thiscall
spvtools::opt::analysis::DecorationManager::CloneDecorations
          (DecorationManager *this,uint32_t from,uint32_t to)

{
  __uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
  this_00;
  Module *this_01;
  initializer_list<unsigned_int> init_list;
  initializer_list<unsigned_int> init_list_00;
  initializer_list<unsigned_int> init_list_01;
  bool bVar1;
  Op OVar2;
  uint32_t uVar3;
  IRContext *this_02;
  pointer ppVar4;
  __uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
  *p_Var5;
  IRContext *c;
  Instruction *pIVar6;
  pointer this_03;
  iterator *piVar7;
  reference ppIVar8;
  Operand *pOVar9;
  uint *puVar10;
  uint32_t local_1fc;
  iterator local_1f8;
  undefined8 local_1f0;
  SmallVector<unsigned_int,_2UL> local_1e8;
  Operand local_1c0;
  undefined1 local_190 [8];
  Operand op;
  uint32_t i;
  uint32_t num_operands;
  undefined8 local_148;
  SmallVector<unsigned_int,_2UL> local_140;
  Operand local_118;
  Instruction *local_e8;
  Instruction *inst_1;
  iterator __end2_1;
  iterator __begin2_1;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *__range2_1;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
  indirect_decorations;
  iterator_template<spvtools::opt::Instruction> local_a8;
  iterator decoration_iter;
  uint32_t local_94;
  iterator local_90;
  undefined8 local_88;
  SmallVector<unsigned_int,_2UL> local_80;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> local_58;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> new_inst;
  Instruction *inst;
  iterator __end2;
  iterator __begin2;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *__range2;
  IRContext *context;
  DebugScope local_20;
  iterator decoration_list;
  uint32_t to_local;
  uint32_t from_local;
  DecorationManager *this_local;
  
  decoration_list.
  super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>,_false>
  ._M_cur._0_4_ = to;
  decoration_list.
  super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>,_false>
  ._M_cur._4_4_ = from;
  local_20 = (DebugScope)
             std::
             unordered_map<unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>_>_>
             ::find(&this->id_to_decoration_insts_,
                    (key_type *)
                    ((long)&decoration_list.
                            super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>,_false>
                            ._M_cur + 4));
  context = (IRContext *)
            std::
            unordered_map<unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>_>_>
            ::end(&this->id_to_decoration_insts_);
  bVar1 = std::__detail::operator==
                    ((_Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>,_false>
                      *)&local_20,
                     (_Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>,_false>
                      *)&context);
  if (!bVar1) {
    this_02 = Module::context(this->module_);
    ppVar4 = std::__detail::
             _Node_iterator<std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>,_false,_false>
             ::operator->((_Node_iterator<std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>,_false,_false>
                           *)&local_20);
    __end2 = std::
             vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
             begin(&(ppVar4->second).direct_decorations);
    inst = (Instruction *)
           std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
           ::end(&(ppVar4->second).direct_decorations);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<spvtools::opt::Instruction_**,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
                                       *)&inst), bVar1) {
      p_Var5 = (__uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                *)__gnu_cxx::
                  __normal_iterator<spvtools::opt::Instruction_**,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
                  ::operator*(&__end2);
      this_00._M_t.
      super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
      .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl = p_Var5->_M_t;
      new_inst._M_t.
      super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
      ._M_t.
      super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
      .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl =
           (__uniq_ptr_data<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>,_true,_true>
            )(__uniq_ptr_data<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>,_true,_true>
              )this_00;
      c = Module::context(this->module_);
      pIVar6 = opt::Instruction::Clone
                         ((Instruction *)
                          this_00._M_t.
                          super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                          .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl,c
                         );
      std::unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>::
      unique_ptr<std::default_delete<spvtools::opt::Instruction>,void>
                ((unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>
                  *)&local_58,pIVar6);
      this_03 = std::
                unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                ::operator->(&local_58);
      local_94 = (uint32_t)
                 decoration_list.
                 super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>,_false>
                 ._M_cur;
      local_90 = &local_94;
      local_88 = 1;
      init_list_01._M_len = 1;
      init_list_01._M_array = local_90;
      utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_80,init_list_01);
      opt::Instruction::SetInOperand(this_03,0,&local_80);
      utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_80);
      this_01 = this->module_;
      std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
      ::unique_ptr((unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                    *)&decoration_iter,&local_58);
      Module::AddAnnotationInst
                (this_01,(unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                          *)&decoration_iter);
      std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
      ::~unique_ptr((unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                     *)&decoration_iter);
      Module::annotation_end
                ((Module *)
                 &indirect_decorations.
                  super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      piVar7 = InstructionList::iterator::operator--
                         ((iterator *)
                          &indirect_decorations.
                           super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
      InstructionList::iterator::iterator((iterator *)&local_a8,piVar7);
      pIVar6 = utils::IntrusiveList<spvtools::opt::Instruction>::
               iterator_template<spvtools::opt::Instruction>::operator*(&local_a8);
      IRContext::AnalyzeUses(this_02,pIVar6);
      std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
      ::~unique_ptr(&local_58);
      __gnu_cxx::
      __normal_iterator<spvtools::opt::Instruction_**,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
      ::operator++(&__end2);
    }
    ppVar4 = std::__detail::
             _Node_iterator<std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>,_false,_false>
             ::operator->((_Node_iterator<std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>,_false,_false>
                           *)&local_20);
    std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::vector
              ((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                *)&__range2_1,&(ppVar4->second).indirect_decorations);
    __end2_1 = std::
               vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
               begin((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                      *)&__range2_1);
    inst_1 = (Instruction *)
             std::
             vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
             end((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                  *)&__range2_1);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2_1,
                              (__normal_iterator<spvtools::opt::Instruction_**,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
                               *)&inst_1), bVar1) {
      ppIVar8 = __gnu_cxx::
                __normal_iterator<spvtools::opt::Instruction_**,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
                ::operator*(&__end2_1);
      local_e8 = *ppIVar8;
      OVar2 = opt::Instruction::opcode(local_e8);
      if (OVar2 == OpGroupDecorate) {
        IRContext::ForgetUses(this_02,local_e8);
        pIVar6 = local_e8;
        i = (uint32_t)
            decoration_list.
            super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>,_false>
            ._M_cur;
        _num_operands = &i;
        local_148 = 1;
        init_list_00._M_len = 1;
        init_list_00._M_array = _num_operands;
        utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_140,init_list_00);
        Operand::Operand(&local_118,SPV_OPERAND_TYPE_ID,&local_140);
        opt::Instruction::AddOperand(pIVar6,&local_118);
        Operand::~Operand(&local_118);
        utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_140);
        IRContext::AnalyzeUses(this_02,local_e8);
      }
      else {
        if (OVar2 != OpGroupMemberDecorate) {
          __assert_fail("false && \"Unexpected decoration instruction\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/decoration_manager.cpp"
                        ,0x22d,
                        "void spvtools::opt::analysis::DecorationManager::CloneDecorations(uint32_t, uint32_t)"
                       );
        }
        IRContext::ForgetUses(this_02,local_e8);
        uVar3 = opt::Instruction::NumOperands(local_e8);
        for (op.words.large_data_._M_t.
             super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             .
             super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
             ._M_head_impl._4_4_ = 1;
            op.words.large_data_._M_t.
            super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
            .
            super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
            ._M_head_impl._4_4_ < uVar3;
            op.words.large_data_._M_t.
            super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
            .
            super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
            ._M_head_impl._4_4_ =
                 op.words.large_data_._M_t.
                 super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 .
                 super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                 ._M_head_impl._4_4_ + 2) {
          pOVar9 = opt::Instruction::GetOperand
                             (local_e8,op.words.large_data_._M_t.
                                       super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                       .
                                       super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                                       ._M_head_impl._4_4_);
          Operand::Operand((Operand *)local_190,pOVar9);
          puVar10 = utils::SmallVector<unsigned_int,_2UL>::operator[]
                              ((SmallVector<unsigned_int,_2UL> *)&op,0);
          pIVar6 = local_e8;
          if (*puVar10 ==
              decoration_list.
              super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>,_false>
              ._M_cur._4_4_) {
            local_1fc = (uint32_t)
                        decoration_list.
                        super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>,_false>
                        ._M_cur;
            local_1f8 = &local_1fc;
            local_1f0 = 1;
            init_list._M_len = 1;
            init_list._M_array = local_1f8;
            utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_1e8,init_list);
            Operand::Operand(&local_1c0,SPV_OPERAND_TYPE_ID,&local_1e8);
            opt::Instruction::AddOperand(pIVar6,&local_1c0);
            Operand::~Operand(&local_1c0);
            utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_1e8);
            pOVar9 = opt::Instruction::GetOperand
                               (local_e8,op.words.large_data_._M_t.
                                         super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                         .
                                         super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                                         ._M_head_impl._4_4_ + 1);
            Operand::operator=((Operand *)local_190,pOVar9);
            opt::Instruction::AddOperand(local_e8,(Operand *)local_190);
          }
          Operand::~Operand((Operand *)local_190);
        }
        IRContext::AnalyzeUses(this_02,local_e8);
      }
      __gnu_cxx::
      __normal_iterator<spvtools::opt::Instruction_**,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
      ::operator++(&__end2_1);
    }
    std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
    ~vector((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *)
            &__range2_1);
  }
  return;
}

Assistant:

void DecorationManager::CloneDecorations(uint32_t from, uint32_t to) {
  const auto decoration_list = id_to_decoration_insts_.find(from);
  if (decoration_list == id_to_decoration_insts_.end()) return;
  auto context = module_->context();
  for (Instruction* inst : decoration_list->second.direct_decorations) {
    // simply clone decoration and change |target-id| to |to|
    std::unique_ptr<Instruction> new_inst(inst->Clone(module_->context()));
    new_inst->SetInOperand(0, {to});
    module_->AddAnnotationInst(std::move(new_inst));
    auto decoration_iter = --module_->annotation_end();
    context->AnalyzeUses(&*decoration_iter);
  }
  // We need to copy the list of instructions as ForgetUses and AnalyzeUses are
  // going to modify it.
  std::vector<Instruction*> indirect_decorations =
      decoration_list->second.indirect_decorations;
  for (Instruction* inst : indirect_decorations) {
    switch (inst->opcode()) {
      case spv::Op::OpGroupDecorate:
        context->ForgetUses(inst);
        // add |to| to list of decorated id's
        inst->AddOperand(
            Operand(spv_operand_type_t::SPV_OPERAND_TYPE_ID, {to}));
        context->AnalyzeUses(inst);
        break;
      case spv::Op::OpGroupMemberDecorate: {
        context->ForgetUses(inst);
        // for each (id == from), add (to, literal) as operands
        const uint32_t num_operands = inst->NumOperands();
        for (uint32_t i = 1; i < num_operands; i += 2) {
          Operand op = inst->GetOperand(i);
          if (op.words[0] == from) {  // add new pair of operands: (to, literal)
            inst->AddOperand(
                Operand(spv_operand_type_t::SPV_OPERAND_TYPE_ID, {to}));
            op = inst->GetOperand(i + 1);
            inst->AddOperand(std::move(op));
          }
        }
        context->AnalyzeUses(inst);
        break;
      }
      default:
        assert(false && "Unexpected decoration instruction");
    }
  }
}